

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

void __thiscall
kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>::move<kj::StringPtr,kj::StringPtr>
          (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *this,ArrayPtr<kj::StringPtr> table
          ,size_t oldPos,size_t newPos,StringPtr *params)

{
  HashBucket *pHVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ArrayPtr<const_unsigned_char> s;
  
  s.size_ = *(long *)(oldPos + 8) - 1;
  s.ptr = *(uchar **)oldPos;
  uVar3 = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s);
  pHVar1 = (this->buckets).ptr;
  uVar2 = (this->buckets).size_;
  uVar4 = (ulong)((int)uVar2 - 1U & uVar3);
  uVar6 = (int)table.ptr + 2;
  uVar3 = pHVar1[uVar4].value;
  if (uVar6 != uVar3) {
    do {
      if (uVar3 == 0) {
        _::logHashTableInconsistency();
        return;
      }
      uVar5 = uVar4 + 1;
      uVar4 = uVar5 & 0xffffffff;
      if (uVar5 == uVar2) {
        uVar4 = 0;
      }
      uVar3 = pHVar1[uVar4].value;
    } while (uVar6 != uVar3);
  }
  pHVar1[uVar4].value = (int)table.size_ + 2;
  return;
}

Assistant:

void move(kj::ArrayPtr<Row> table, size_t oldPos, size_t newPos, Params&&... params) {
    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isPos(oldPos)) {
        // found it
        bucket.setPos(newPos);
        return;
      } else if (bucket.isEmpty()) {
        // can't find the bucket, something is very wrong
        _::logHashTableInconsistency();
        return;
      }
    }
  }